

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

CWordWidthHint __thiscall
CTextRender::MakeWord
          (CTextRender *this,CTextCursor *pCursor,char *pText,char *pEnd,int FontSizeIndex,
          float Size,int PixelSize,vec2 ScreenScale)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  CWordWidthHint CVar4;
  CGlyph *pCVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *in_RCX;
  char *in_RDX;
  long in_RSI;
  CTextRender *in_RDI;
  long in_FS_OFFSET;
  bool bVar10;
  float in_XMM0_Da;
  float fVar11;
  bool CanBreak;
  bool IsSpace;
  float AdvanceX;
  vec2 Kerning;
  int NumChars;
  int CharCount;
  CGlyph *pGlyph;
  int Chr;
  float WordStartAdvanceX;
  float MaxWidth;
  float Scale;
  CGlyph *pNextGlyph;
  int NextChr;
  bool AllowNewline;
  bool BreakWord;
  bool Render;
  CWordWidthHint Hint;
  char *pCur;
  CScaledGlyph Scaled;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  CScaledGlyph *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined5 in_stack_fffffffffffffef0;
  byte in_stack_fffffffffffffef5;
  byte in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  undefined2 in_stack_ffffffffffffff00;
  byte in_stack_ffffffffffffff02;
  uint in_stack_ffffffffffffff03;
  undefined1 in_stack_ffffffffffffff07;
  vector2_base<float> in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar12;
  float local_d8;
  CGlyph *local_d0;
  int local_c4;
  float local_88;
  int iStack_84;
  int local_80;
  bool bStack_7c;
  undefined1 uStack_7b;
  undefined2 uStack_7a;
  vector4_base<float> local_78;
  vector4_base<float> local_68;
  vec2 local_58;
  char *local_50;
  CGlyph *local_48;
  int local_3c;
  int local_38;
  undefined8 local_34;
  vector4_base<float> local_2c;
  vector4_base<float> local_1c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar10 = (*(uint *)(in_RSI + 0x58) & 1) == 0;
  uVar2 = *(uint *)(in_RSI + 0x58);
  uVar3 = *(uint *)(in_RSI + 0x58);
  local_50 = in_RDX;
  local_c4 = str_utf8_decode(&local_50);
  local_d0 = (CGlyph *)0x0;
  if (0 < local_c4) {
    if ((local_c4 == 10) || (local_c4 == 9)) {
      local_d0 = CGlyphMap::GetGlyph((CGlyphMap *)
                                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                     (int)in_stack_ffffffffffffff08.field_1,
                                     (int)in_stack_ffffffffffffff08.field_0,
                                     (bool)in_stack_ffffffffffffff07);
    }
    else {
      local_d0 = CGlyphMap::GetGlyph((CGlyphMap *)
                                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                     (int)in_stack_ffffffffffffff08.field_1,
                                     (int)in_stack_ffffffffffffff08.field_0,
                                     (bool)in_stack_ffffffffffffff07);
    }
  }
  local_d8 = *(float *)(in_RSI + 0x50);
  if (local_d8 < 0.0) {
    local_d8 = INFINITY;
  }
  fVar1 = *(float *)(in_RSI + 0x20);
  iStack_84 = 0;
  local_80 = 0;
  local_88 = *(float *)(in_RSI + 0x20);
  bStack_7c = false;
  uStack_7b = 0;
  if ((*in_RDX == '\0') || (in_RCX < local_50)) {
    iStack_84 = -1;
    iVar9 = local_80;
  }
  else {
    do {
      pCVar5 = local_d0;
      iVar7 = (int)local_50 - (int)in_RDX;
      iStack_84 = iVar7 - iStack_84;
      iVar9 = local_80;
      if ((local_c4 == 0) || (in_RCX < local_50)) {
        iStack_84 = iVar7 + -1;
        break;
      }
      if ((local_d0 == (CGlyph *)0x0) || (local_c4 < 0)) {
        iStack_84 = -1;
        break;
      }
      iVar12 = iVar7;
      iVar8 = str_utf8_decode(&local_50);
      local_d0 = (CGlyph *)0x0;
      if (0 < iVar8) {
        if ((iVar8 == 10) || (iVar8 == 9)) {
          local_d0 = CGlyphMap::GetGlyph((CGlyphMap *)CONCAT44(iVar12,iStack_84),
                                         (int)in_stack_ffffffffffffff08.field_1,
                                         (int)in_stack_ffffffffffffff08.field_0,
                                         (bool)in_stack_ffffffffffffff07);
        }
        else {
          local_d0 = CGlyphMap::GetGlyph((CGlyphMap *)CONCAT44(iVar12,iStack_84),
                                         (int)in_stack_ffffffffffffff08.field_1,
                                         (int)in_stack_ffffffffffffff08.field_0,
                                         (bool)in_stack_ffffffffffffff07);
        }
      }
      local_58 = CGlyphMap::Kerning((CGlyphMap *)
                                    CONCAT17(in_stack_ffffffffffffff07,
                                             CONCAT43(in_stack_ffffffffffffff03,
                                                      CONCAT12(in_stack_ffffffffffffff02,
                                                               in_stack_ffffffffffffff00))),
                                    (CGlyph *)in_RDI,
                                    (CGlyph *)
                                    CONCAT17(in_stack_fffffffffffffef7,
                                             CONCAT16(in_stack_fffffffffffffef6,
                                                      CONCAT15(in_stack_fffffffffffffef5,
                                                               in_stack_fffffffffffffef0))),
                                    (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      in_stack_ffffffffffffff08 =
           vector2_base<float>::operator*
                     ((vector2_base<float> *)
                      CONCAT17(in_stack_fffffffffffffef7,
                               CONCAT16(in_stack_fffffffffffffef6,
                                        CONCAT15(in_stack_fffffffffffffef5,in_stack_fffffffffffffef0
                                                ))),
                      (float)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      fVar11 = (pCVar5->m_AdvanceX + in_stack_ffffffffffffff08.field_0.x) * in_XMM0_Da;
      in_stack_ffffffffffffff07 = (undefined1)((uint)fVar11 >> 0x18);
      in_stack_fffffffffffffef7 = true;
      if ((local_c4 != 10) && (in_stack_fffffffffffffef7 = true, local_c4 != 9)) {
        in_stack_fffffffffffffef7 = local_c4 == 0x20;
      }
      in_stack_ffffffffffffff03 = CONCAT31(SUB43(fVar11,0),in_stack_fffffffffffffef7);
      in_stack_fffffffffffffef6 = 0;
      if (((bool)in_stack_fffffffffffffef7 == false) &&
         (in_stack_fffffffffffffef5 = 1, in_stack_fffffffffffffef6 = in_stack_fffffffffffffef5,
         (uVar2 & 8) != 0)) {
        in_stack_fffffffffffffef5 = *(byte *)(in_RSI + 0x60);
        in_stack_fffffffffffffef6 = in_stack_fffffffffffffef5;
      }
      in_stack_ffffffffffffff02 = in_stack_fffffffffffffef6 & 1;
      if ((local_d8 < local_88 - fVar1) ||
         ((in_stack_ffffffffffffff02 != 0 && (local_d8 < *(float *)(in_RSI + 0x20) + fVar11)))) {
        uStack_7b = 1;
        iStack_84 = iVar7 - iStack_84;
        break;
      }
      if (bVar10) {
        CScaledGlyph::CScaledGlyph(in_stack_fffffffffffffee0);
        local_48 = pCVar5;
        local_34 = *(undefined8 *)(in_RSI + 0x20);
        local_38 = *(int *)(in_RSI + 0x10) + -1;
        vector4_base<float>::vector4_base
                  (&local_68,in_RDI->m_TextR,in_RDI->m_TextG,in_RDI->m_TextB,in_RDI->m_TextA);
        local_2c.field_0 = local_68.field_0;
        local_2c.field_1 = local_68.field_1;
        local_2c.field_2 = local_68.field_2;
        local_2c.field_3 = local_68.field_3;
        vector4_base<float>::vector4_base
                  (&local_78,in_RDI->m_TextSecondaryR,in_RDI->m_TextSecondaryG,
                   in_RDI->m_TextSecondaryB,in_RDI->m_TextSecondaryA);
        local_1c.field_0 = local_78.field_0;
        local_1c.field_1 = local_78.field_1;
        local_1c.field_2 = local_78.field_2;
        local_1c.field_3 = local_78.field_3;
        local_3c = iStack_84;
        array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::add
                  ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)
                   in_stack_fffffffffffffee0,
                   (CScaledGlyph *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      }
      *(float *)(in_RSI + 0x20) =
           (float)CONCAT13(in_stack_ffffffffffffff07,(int3)(in_stack_ffffffffffffff03 >> 8)) +
           *(float *)(in_RSI + 0x20);
      iVar9 = local_80 + 1;
      iStack_84 = iVar7;
      if (((in_stack_ffffffffffffff03 & 1) != 0) || (local_c4 == 0)) {
        bStack_7c = local_c4 == 10;
        if (((uVar3 & 2) != 0) && ((bStack_7c && (iVar9 = local_80, bVar10)))) {
          array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::size
                    ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0x30));
          array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::remove_index
                    ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)
                     in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
        }
        break;
      }
      local_88 = *(float *)(in_RSI + 0x20);
      bVar6 = isWestern(in_RDI,local_c4);
      local_c4 = iVar8;
      local_80 = iVar9;
    } while (bVar6);
  }
  local_80 = iVar9;
  CVar4.m_EndsWithNewline = bStack_7c;
  CVar4.m_GlyphCount = local_80;
  CVar4.m_IsBroken = (bool)uStack_7b;
  CVar4._14_2_ = uStack_7a;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  CVar4.m_CharCount = iStack_84;
  CVar4.m_EffectiveAdvanceX = local_88;
  return CVar4;
}

Assistant:

CWordWidthHint CTextRender::MakeWord(CTextCursor *pCursor, const char *pText, const char *pEnd, 
								int FontSizeIndex, float Size, int PixelSize, vec2 ScreenScale)
{
	bool Render = !(pCursor->m_Flags & TEXTFLAG_NO_RENDER);
	bool BreakWord = !(pCursor->m_Flags & TEXTFLAG_WORD_WRAP);
	bool AllowNewline = pCursor->m_Flags & TEXTFLAG_ALLOW_NEWLINE;
	CWordWidthHint Hint;
	const char *pCur = pText;
	int NextChr = str_utf8_decode(&pCur);
	CGlyph *pNextGlyph = NULL;
	if(NextChr > 0)
	{
		if(NextChr == '\n' || NextChr == '\t')
			pNextGlyph = m_pGlyphMap->GetGlyph(' ', FontSizeIndex, Render);
		else
			pNextGlyph = m_pGlyphMap->GetGlyph(NextChr, FontSizeIndex, Render);
	}

	float Scale = 1.0f/PixelSize;
	float MaxWidth = pCursor->m_MaxWidth;
	if(MaxWidth < 0)
		MaxWidth = INFINITY;

	float WordStartAdvanceX = pCursor->m_Advance.x;

	Hint.m_CharCount = 0;
	Hint.m_GlyphCount = 0;
	Hint.m_EffectiveAdvanceX = pCursor->m_Advance.x;
	Hint.m_EndsWithNewline = false;
	Hint.m_IsBroken = false;

	if(*pText == '\0' || pCur > pEnd)
	{
		Hint.m_CharCount = -1;
		return Hint;
	}

	while(1)
	{
		int Chr = NextChr;
		CGlyph *pGlyph = pNextGlyph;
		int CharCount = pCur - pText;
		int NumChars = CharCount - Hint.m_CharCount;
		Hint.m_CharCount = CharCount;

		if(Chr == 0 || pCur > pEnd)
		{
			Hint.m_CharCount--;
			break;
		}

		if(!pGlyph || Chr < 0)
		{
			Hint.m_CharCount = -1;
			return Hint;
		}

		NextChr = str_utf8_decode(&pCur);
		pNextGlyph = NULL;
		if(NextChr > 0)
		{
			if(NextChr == '\n' || NextChr == '\t')
				pNextGlyph = m_pGlyphMap->GetGlyph(' ', FontSizeIndex, Render);
			else
				pNextGlyph = m_pGlyphMap->GetGlyph(NextChr, FontSizeIndex, Render);
		}

		vec2 Kerning = m_pGlyphMap->Kerning(pGlyph, pNextGlyph, PixelSize) * Scale;
		float AdvanceX = (pGlyph->m_AdvanceX + Kerning.x) * Size;
	
		bool IsSpace = Chr == '\n' || Chr == '\t' || Chr == ' ';
		bool CanBreak = !IsSpace && (BreakWord || pCursor->m_StartOfLine);
		if(Hint.m_EffectiveAdvanceX - WordStartAdvanceX > MaxWidth || (CanBreak && pCursor->m_Advance.x + AdvanceX > MaxWidth))
		{
			Hint.m_CharCount -= NumChars;
			Hint.m_IsBroken = true;
			break;
		}

		if(Render)
		{
			CScaledGlyph Scaled;
			Scaled.m_pGlyph = pGlyph;
			Scaled.m_Advance = pCursor->m_Advance;
			Scaled.m_Size = Size;
			Scaled.m_Line = pCursor->m_LineCount - 1;
			Scaled.m_TextColor = vec4(m_TextR, m_TextG, m_TextB, m_TextA);
			Scaled.m_SecondaryColor = vec4(m_TextSecondaryR, m_TextSecondaryG, m_TextSecondaryB, m_TextSecondaryA);
			Scaled.m_NumChars = NumChars;
			pCursor->m_Glyphs.add(Scaled);
		}
		
		pCursor->m_Advance.x += AdvanceX;
		Hint.m_GlyphCount++;

		if(IsSpace || Chr == 0)
		{
			Hint.m_EndsWithNewline = Chr == '\n';
			if(AllowNewline && Hint.m_EndsWithNewline)
			{
				// remove redundant space
				Hint.m_GlyphCount--;
				if(Render)
					pCursor->m_Glyphs.remove_index(pCursor->m_Glyphs.size()-1);
			}
			break;
		}

		Hint.m_EffectiveAdvanceX = pCursor->m_Advance.x;

		// break every char on non latin/greek characters
		if(!isWestern(Chr))
			break;
	}

	return Hint;
}